

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void c4::mem_repeat(void *dest,void *pattern,size_t pattern_size,size_t num_times)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  
  if (num_times != 0) {
    lVar4 = num_times * pattern_size;
    if (pattern < (void *)((long)dest + lVar4) && dest < (void *)((long)pattern + pattern_size)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      handle_error(0x1f7f77,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x433c,"! mem_overlaps(dest, pattern, num_times*pattern_size, pattern_size)");
    }
    memcpy(dest,pattern,pattern_size);
    for (sVar2 = pattern_size * 2; (long)sVar2 < lVar4; sVar2 = sVar2 * 2) {
      memcpy((void *)((long)dest + pattern_size),dest,pattern_size);
      pattern_size = sVar2;
    }
    if (lVar4 - pattern_size != 0 && (long)pattern_size <= lVar4) {
      memcpy((void *)(pattern_size + (long)dest),dest,lVar4 - pattern_size);
      return;
    }
  }
  return;
}

Assistant:

void mem_repeat(void* dest, void const* pattern, size_t pattern_size, size_t num_times)
{
    if(C4_UNLIKELY(num_times == 0))
        return;
    C4_ASSERT( ! mem_overlaps(dest, pattern, num_times*pattern_size, pattern_size));
    char *begin = (char*)dest;
    char *end   = begin + num_times * pattern_size;
    // copy the pattern once
    ::memcpy(begin, pattern, pattern_size);
    // now copy from dest to itself, doubling up every time
    size_t n = pattern_size;
    while(begin + 2*n < end)
    {
        ::memcpy(begin + n, begin, n);
        n <<= 1; // double n
    }
    // copy the missing part
    if(begin + n < end)
    {
        ::memcpy(begin + n, begin, static_cast<size_t>(end - (begin + n)));
    }
}